

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

string * BamTools::Internal::BamToolsIndex::Extension_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)&BTI_EXTENSION_abi_cxx11_);
  return in_RDI;
}

Assistant:

const std::string BamToolsIndex::Extension()
{
    return BamToolsIndex::BTI_EXTENSION;
}